

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_enum_flag(flatcc_json_printer_t *ctx,int count,char *symbol,size_t len)

{
  *ctx->p = ' ';
  ctx->p = ctx->p + (0 < count);
  print(ctx,symbol,len);
  return;
}

Assistant:

void flatcc_json_printer_enum_flag(flatcc_json_printer_t *ctx, int count, const char *symbol, size_t len)
{
    *ctx->p = ' ';
    ctx->p += count > 0;
    print(ctx, symbol, len);
}